

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Fossilize::Instance::Instance(Instance *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *sync;
  char *sigsegv;
  Instance *this_local;
  
  ScratchAllocator::ScratchAllocator(&this->alloc);
  this->pAppInfo = (VkApplicationInfo *)0x0;
  this->instance = (VkInstance)0x0;
  this->pTable = (VkLayerInstanceDispatchTable *)0x0;
  this->gpa = (PFN_vkGetInstanceProcAddr)0x0;
  this->infoFilter = (ApplicationInfoFilter *)0x0;
  this->enableCrashHandler = false;
  this->synchronized = false;
  this->enablePrecompileQA = false;
  this->shouldRecordImmutableSamplers = true;
  pcVar2 = getenv("FOSSILIZE_DUMP_SIGSEGV");
  if (pcVar2 != (char *)0x0) {
    uVar3 = strtoul(pcVar2,(char **)0x0,0);
    if (uVar3 != 0) {
      installSegfaultHandler();
      this->enableCrashHandler = true;
    }
  }
  pcVar2 = getenv("FOSSILIZE_DUMP_SYNC");
  if (pcVar2 != (char *)0x0) {
    uVar3 = strtoul(pcVar2,(char **)0x0,0);
    if (uVar3 != 0) {
      this->synchronized = true;
    }
  }
  bVar1 = queryPrecompileQA();
  this->enablePrecompileQA = bVar1;
  return;
}

Assistant:

Instance::Instance()
{
#ifdef FOSSILIZE_LAYER_CAPTURE_SIGSEGV
#ifdef ANDROID
	auto sigsegv = getSystemProperty("debug.fossilize.dump_sigsegv");
	if (!sigsegv.empty() && strtoul(sigsegv.c_str(), nullptr, 0) != 0)
	{
		installSegfaultHandler();
		enableCrashHandler = true;
	}
#else
	const char *sigsegv = getenv("FOSSILIZE_DUMP_SIGSEGV");
	if (sigsegv && strtoul(sigsegv, nullptr, 0) != 0)
	{
		installSegfaultHandler();
		enableCrashHandler = true;
	}
#endif
#endif

#ifndef ANDROID
	const char *sync = getenv(FOSSILIZE_DUMP_SYNC_ENV);
	if (sync && strtoul(sync, nullptr, 0) != 0)
		synchronized = true;
#endif

	enablePrecompileQA = queryPrecompileQA();
}